

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# harvest.cc
# Opt level: O0

void sptk::world::anon_unknown_2::FilteringF0
               (double *a,double *b,double *x,int x_length,int st,int ed,double *y)

{
  undefined1 auVar1 [16];
  ulong uVar2;
  void *pvVar3;
  int in_ECX;
  long in_RDX;
  double *in_RSI;
  double *in_RDI;
  int in_R8D;
  int in_R9D;
  double dVar4;
  long in_stack_00000008;
  int i_3;
  int i_2;
  int i_1;
  int i;
  double *tmp_x;
  double wt;
  double w [2];
  int local_58;
  int local_54;
  int local_50;
  int local_4c;
  double local_38;
  double local_30;
  int local_24;
  int local_20;
  int local_1c;
  long local_18;
  double *local_10;
  double *local_8;
  
  local_24 = in_R9D;
  local_20 = in_R8D;
  local_1c = in_ECX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  memset(&local_38,0,0x10);
  auVar1._8_8_ = 0;
  auVar1._0_8_ = (long)local_1c;
  uVar2 = SUB168(auVar1 * ZEXT816(8),0);
  if (SUB168(auVar1 * ZEXT816(8),8) != 0) {
    uVar2 = 0xffffffffffffffff;
  }
  pvVar3 = operator_new__(uVar2);
  for (local_4c = 0; local_50 = local_24, local_4c < local_20; local_4c = local_4c + 1) {
    *(undefined8 *)(local_18 + (long)local_4c * 8) = *(undefined8 *)(local_18 + (long)local_20 * 8);
  }
  while (local_50 = local_50 + 1, local_50 < local_1c) {
    *(undefined8 *)(local_18 + (long)local_50 * 8) = *(undefined8 *)(local_18 + (long)local_24 * 8);
  }
  for (local_54 = 0; local_54 < local_1c; local_54 = local_54 + 1) {
    dVar4 = local_8[1] * local_30 + *local_8 * local_38 + *(double *)(local_18 + (long)local_54 * 8)
    ;
    *(double *)((long)pvVar3 + (long)((local_1c - local_54) + -1) * 8) =
         *local_10 * local_30 + *local_10 * dVar4 + local_10[1] * local_38;
    local_30 = local_38;
    local_38 = dVar4;
  }
  local_30 = 0.0;
  local_38 = 0.0;
  for (local_58 = 0; local_58 < local_1c; local_58 = local_58 + 1) {
    dVar4 = local_8[1] * local_30 +
            *local_8 * local_38 + *(double *)((long)pvVar3 + (long)local_58 * 8);
    *(double *)(in_stack_00000008 + (long)((local_1c - local_58) + -1) * 8) =
         *local_10 * local_30 + *local_10 * dVar4 + local_10[1] * local_38;
    local_30 = local_38;
    local_38 = dVar4;
  }
  if (pvVar3 != (void *)0x0) {
    operator_delete__(pvVar3);
  }
  return;
}

Assistant:

static void FilteringF0(const double *a, const double *b, double *x,
    int x_length, int st, int ed, double *y) {
  double w[2] = { 0.0, 0.0 };
  double wt;
  double *tmp_x = new double[x_length];

  for (int i = 0; i < st; ++i) x[i] = x[st];
  for (int i = ed + 1; i < x_length; ++i) x[i] = x[ed];

  for (int i = 0; i < x_length; ++i) {
    wt = x[i] + a[0] * w[0] + a[1] * w[1];
    tmp_x[x_length - i - 1] = b[0] * wt + b[1] * w[0] + b[0] * w[1];
    w[1] = w[0];
    w[0] = wt;
  }

  w[0] = w[1] = 0.0;
  for (int i = 0; i < x_length; ++i) {
    wt = tmp_x[i] + a[0] * w[0] + a[1] * w[1];
    y[x_length - i - 1] = b[0] * wt + b[1] * w[0] + b[0] * w[1];
    w[1] = w[0];
    w[0] = wt;
  }

  delete[] tmp_x;
}